

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_mod3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  uint16_t uVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  short sVar5;
  short sVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = q >> 1;
  iVar3 = (uint)(ushort)((ulong)(uVar8 - 1) * 0x555555555555 >> 0x30) * -3 + uVar8 + -1;
  for (uVar7 = 0; p != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = reduce(in[uVar7] + uVar8,(uint16_t)q,
                   SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0));
    uVar4 = (uint)uVar1 + (((uint)(-1 < (short)((short)iVar3 + -3)) * 3 - iVar3) + 3 & 0xffff);
    sVar5 = (short)((ulong)uVar4 * 0x555555555555 >> 0x30) * -3;
    sVar2 = (short)uVar4;
    sVar6 = sVar5 + sVar2;
    sVar2 = sVar5 + -3 + sVar2;
    if ((short)(sVar6 + -3) < 0) {
      sVar2 = sVar6;
    }
    out[uVar7] = sVar2 - 1;
  }
  return;
}

Assistant:

void ntru_mod3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    uint64_t qrecip = reciprocal_for_reduction(q);
    uint64_t recip3 = reciprocal_for_reduction(3);

    unsigned bias = q/2;
    uint16_t adjust = 3 - reduce(bias-1, 3, recip3);

    for (unsigned i = 0; i < p; i++) {
        uint16_t val = reduce(in[i] + bias, q, qrecip);
        uint16_t residue = reduce(val + adjust, 3, recip3);
        out[i] = residue - 1;
    }
}